

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::CubeArrayImageTypeCase::checkRequirements
          (CubeArrayImageTypeCase *this)

{
  int iVar1;
  ContextInfo *pCVar2;
  NotSupportedError *this_00;
  allocator<char> local_31;
  string local_30;
  CubeArrayImageTypeCase *local_10;
  CubeArrayImageTypeCase *this_local;
  
  local_10 = this;
  pCVar2 = Context::getContextInfo((this->super_BaseTypeCase).super_TestCase.m_context);
  iVar1 = (*pCVar2->_vptr_ContextInfo[2])(pCVar2,0x90ce);
  if (iVar1 < 1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Test requires fragment images",&local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  return;
}

Assistant:

void CubeArrayImageTypeCase::checkRequirements (void) const
{
	if (m_context.getContextInfo().getInt(GL_MAX_FRAGMENT_IMAGE_UNIFORMS) < 1)
		throw tcu::NotSupportedError("Test requires fragment images");
}